

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::val::ValidationState_t::GetComponentType(ValidationState_t *this,uint32_t id)

{
  uint16_t uVar1;
  Instruction *pIVar2;
  
  do {
    pIVar2 = FindDef(this,id);
    if (pIVar2 == (Instruction *)0x0) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x361,
                    "uint32_t spvtools::val::ValidationState_t::GetComponentType(uint32_t) const");
    }
    uVar1 = (pIVar2->inst_).opcode;
    switch(uVar1) {
    case 0x14:
    case 0x15:
    case 0x16:
      return id;
    case 0x17:
    case 0x1c:
switchD_00191a14_caseD_17:
      return (pIVar2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[2];
    case 0x18:
      id = (pIVar2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[2];
      break;
    default:
      if ((uVar1 == 0x1168) || (uVar1 == 0x14ee)) goto switchD_00191a14_caseD_17;
    case 0x19:
    case 0x1a:
    case 0x1b:
      id = (pIVar2->inst_).type_id;
      if (id == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x37c,
                      "uint32_t spvtools::val::ValidationState_t::GetComponentType(uint32_t) const")
        ;
      }
    }
  } while( true );
}

Assistant:

uint32_t ValidationState_t::GetComponentType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);

  switch (inst->opcode()) {
    case spv::Op::OpTypeFloat:
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeBool:
      return id;

    case spv::Op::OpTypeArray:
      return inst->word(2);

    case spv::Op::OpTypeVector:
      return inst->word(2);

    case spv::Op::OpTypeMatrix:
      return GetComponentType(inst->word(2));

    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      return inst->word(2);

    default:
      break;
  }

  if (inst->type_id()) return GetComponentType(inst->type_id());

  assert(0);
  return 0;
}